

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O3

TextureFormat glu::mapGLTransferFormat(deUint32 format,deUint32 dataType)

{
  bool bVar1;
  bool normalized;
  ChannelType CVar2;
  InternalError *this;
  long *plVar3;
  size_type *psVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  ulong local_c0;
  string local_b8;
  ulong local_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  normalized = true;
  if ((int)format < 0x80e1) {
    bVar1 = true;
    switch(format) {
    case 0x1902:
      uVar5 = 0x12;
      break;
    case 0x1903:
switchD_004f612f_caseD_1903:
      normalized = bVar1;
      uVar5 = 0;
      break;
    default:
      goto switchD_004f612f_caseD_1904;
    case 0x1906:
      uVar5 = 1;
      break;
    case 0x1907:
      uVar5 = 7;
      break;
    case 0x1908:
      uVar5 = 8;
      break;
    case 0x1909:
      uVar5 = 3;
      break;
    case 0x190a:
      uVar5 = 4;
    }
  }
  else {
    if ((int)format < 0x84f9) {
      if (format == 0x80e1) {
        uVar5 = 0xb;
        goto LAB_004f61e7;
      }
      if (format == 0x8227) {
        uVar5 = 5;
        goto LAB_004f61e7;
      }
      if (format != 0x8228) goto switchD_004f612f_caseD_1904;
      uVar5 = 5;
    }
    else {
      if ((int)format < 0x8d98) {
        if (format == 0x84f9) {
          uVar5 = 0x14;
          goto LAB_004f61e7;
        }
        if (format != 0x8d94) goto switchD_004f612f_caseD_1904;
        bVar1 = false;
        goto switchD_004f612f_caseD_1903;
      }
      if (format == 0x8d98) {
        uVar5 = 7;
      }
      else {
        if (format != 0x8d99) {
switchD_004f612f_caseD_1904:
          this = (InternalError *)__cxa_allocate_exception(0x38);
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_120,"Can\'t map GL pixel format (","");
          local_98 = (ulong)format;
          tcu::Format::Hex<8ul>::toString_abi_cxx11_(&local_90,&local_98);
          std::operator+(&local_70,&local_120,&local_90);
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
          local_100._M_dataplus._M_p = (pointer)*plVar3;
          psVar4 = (size_type *)(plVar3 + 2);
          if ((size_type *)local_100._M_dataplus._M_p == psVar4) {
            local_100.field_2._M_allocated_capacity = *psVar4;
            local_100.field_2._8_8_ = plVar3[3];
            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
          }
          else {
            local_100.field_2._M_allocated_capacity = *psVar4;
          }
          local_100._M_string_length = plVar3[1];
          *plVar3 = (long)psVar4;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          local_c0 = (ulong)dataType;
          tcu::Format::Hex<8ul>::toString_abi_cxx11_(&local_b8,&local_c0);
          std::operator+(&local_50,&local_100,&local_b8);
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
          local_e0._M_dataplus._M_p = (pointer)*plVar3;
          psVar4 = (size_type *)(plVar3 + 2);
          if ((size_type *)local_e0._M_dataplus._M_p == psVar4) {
            local_e0.field_2._M_allocated_capacity = *psVar4;
            local_e0.field_2._8_8_ = plVar3[3];
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          }
          else {
            local_e0.field_2._M_allocated_capacity = *psVar4;
          }
          local_e0._M_string_length = plVar3[1];
          *plVar3 = (long)psVar4;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          tcu::InternalError::InternalError(this,&local_e0);
          __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
        }
        uVar5 = 8;
      }
    }
    normalized = false;
  }
LAB_004f61e7:
  CVar2 = mapGLChannelType(dataType,normalized);
  return (TextureFormat)((ulong)CVar2 << 0x20 | uVar5);
}

Assistant:

tcu::TextureFormat mapGLTransferFormat (deUint32 format, deUint32 dataType)
{
	using tcu::TextureFormat;
	switch (format)
	{
		case GL_ALPHA:				return TextureFormat(TextureFormat::A,		mapGLChannelType(dataType, true));
		case GL_LUMINANCE:			return TextureFormat(TextureFormat::L,		mapGLChannelType(dataType, true));
		case GL_LUMINANCE_ALPHA:	return TextureFormat(TextureFormat::LA,		mapGLChannelType(dataType, true));
		case GL_RGB:				return TextureFormat(TextureFormat::RGB,	mapGLChannelType(dataType, true));
		case GL_RGBA:				return TextureFormat(TextureFormat::RGBA,	mapGLChannelType(dataType, true));
		case GL_BGRA:				return TextureFormat(TextureFormat::BGRA,	mapGLChannelType(dataType, true));
		case GL_RG:					return TextureFormat(TextureFormat::RG,		mapGLChannelType(dataType, true));
		case GL_RED:				return TextureFormat(TextureFormat::R,		mapGLChannelType(dataType, true));
		case GL_RGBA_INTEGER:		return TextureFormat(TextureFormat::RGBA,	mapGLChannelType(dataType, false));
		case GL_RGB_INTEGER:		return TextureFormat(TextureFormat::RGB,	mapGLChannelType(dataType, false));
		case GL_RG_INTEGER:			return TextureFormat(TextureFormat::RG,		mapGLChannelType(dataType, false));
		case GL_RED_INTEGER:		return TextureFormat(TextureFormat::R,		mapGLChannelType(dataType, false));

		case GL_DEPTH_COMPONENT:	return TextureFormat(TextureFormat::D,		mapGLChannelType(dataType, true));
		case GL_DEPTH_STENCIL:		return TextureFormat(TextureFormat::DS,		mapGLChannelType(dataType, true));

		default:
			throw tcu::InternalError(string("Can't map GL pixel format (") + tcu::toHex(format).toString() + ", " + tcu::toHex(dataType).toString() + ") to texture format");
	}
}